

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O3

int loop(sockaddr_in *address)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  pointer pSVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  time_t tVar9;
  ostream *poVar10;
  long *plVar11;
  long lVar12;
  size_t sVar13;
  socklen_t __len;
  ulong __nbytes;
  size_type *psVar14;
  sockaddr *__addr;
  int iVar15;
  char *pcVar16;
  int iVar17;
  Type urn;
  Segment *segment;
  pointer pSVar18;
  uint uVar19;
  string mediaSession;
  string videoID;
  string state;
  string customState;
  string payload;
  Connection connection;
  string type;
  CastMessage message;
  string msgLengthBuffer;
  string response;
  timeval timeout;
  fd_set fdset;
  string local_2e0;
  double local_2c0;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  int local_234;
  Connection local_230;
  string local_208;
  string local_1e8;
  string local_1c8;
  char local_1a8;
  undefined7 uStack_1a7;
  char *local_198;
  long local_190;
  char local_188;
  undefined7 uStack_187;
  char *local_178;
  long local_170;
  char local_168;
  undefined7 uStack_167;
  undefined4 local_158;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  double local_110;
  SSL_CTX **local_108;
  SSL_METHOD *local_100;
  SSL_CTX *local_f8 [2];
  SSL_CTX **local_e8;
  SSL_METHOD *local_e0;
  SSL_CTX *local_d8 [2];
  timeval local_c8;
  fd_set local_b8;
  
  __len = 0x11ed53;
  std::__cxx11::string::_M_replace(0x12a8e0,0,DAT_0012a8e8,0x11ed53);
  if (s_verbose == true) {
    puts("Opening connection");
  }
  Connection::Connection(&local_230);
  iVar6 = Connection::connect(&local_230,(int)address,__addr,__len);
  if ((char)iVar6 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to connect to ",0x15);
    pcVar16 = inet_ntoa((in_addr)(address->sin_addr).s_addr);
    if (pcVar16 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12b448);
    }
    else {
      sVar13 = strlen(pcVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar16,sVar13);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  else {
    if (s_verbose == true) {
      puts("Sending connection message");
    }
    bVar5 = cc::sendSimple(&local_230,Connect,Connection);
    if (bVar5) {
      puts("Connected");
      bVar5 = cc::sendSimple(&local_230,GetStatus,Receiver);
      if (bVar5) {
        iVar6 = 0;
        s_lastPing = time((time_t *)0x0);
        iVar7 = local_234;
        if (s_running == '\0') {
          do {
            local_234 = iVar7;
            iVar6 = 0;
            if ((local_230.eof & 1U) != 0) goto LAB_0010af4f;
            local_b8.fds_bits[0xe] = 0;
            local_b8.fds_bits[0xf] = 0;
            local_b8.fds_bits[0xc] = 0;
            local_b8.fds_bits[0xd] = 0;
            local_b8.fds_bits[10] = 0;
            local_b8.fds_bits[0xb] = 0;
            local_b8.fds_bits[8] = 0;
            local_b8.fds_bits[9] = 0;
            local_b8.fds_bits[6] = 0;
            local_b8.fds_bits[7] = 0;
            local_b8.fds_bits[4] = 0;
            local_b8.fds_bits[5] = 0;
            local_b8.fds_bits[2] = 0;
            local_b8.fds_bits[3] = 0;
            local_b8.fds_bits[0] = 0;
            local_b8.fds_bits[1] = 0;
            uVar19 = local_230.fd + 0x3f;
            if (-1 < local_230.fd) {
              uVar19 = local_230.fd;
            }
            local_b8.fds_bits[(int)uVar19 >> 6] =
                 local_b8.fds_bits[(int)uVar19 >> 6] | 1L << ((byte)(local_230.fd % 0x40) & 0x3f);
            local_b8.fds_bits[0] = local_b8.fds_bits[0] | 1;
            local_c8.tv_sec = 1;
            local_c8.tv_usec = 0;
            iVar7 = select(local_230.fd + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
            dVar2 = currentPosition();
            if (((dVar2 < 0.0) || (local_2c0 = currentDuration, currentDuration < 0.0)) ||
               (s_lastPositionFetched < 0.0)) {
              printf("%s",s_currentStatus_abi_cxx11_._M_dataplus._M_p);
            }
            else {
              local_110 = dVar2;
              printf("\r[");
              iVar17 = (int)((local_110 * 40.0) / local_2c0);
              iVar6 = 0x28;
              if (iVar17 < 0x28) {
                iVar6 = iVar17;
              }
              iVar15 = iVar6;
              if (0 < iVar17) {
                do {
                  putchar(0x3d);
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              iVar15 = 0x7c;
              if (currentlyPlaying != false) {
                iVar15 = 0x3e;
              }
              putchar(iVar15);
              if (iVar17 < 0x28) {
                iVar6 = iVar6 + -0x28;
                do {
                  putchar(0x2d);
                  iVar6 = iVar6 + 1;
                } while (iVar6 != 0);
              }
              printf("] ");
              iVar6 = (int)local_110;
              printf("%.2d:%.2d:%.2d",(ulong)(uint)((iVar6 / 0xe10) % 0x3c),
                     (ulong)(uint)((iVar6 / 0x3c) % 0x3c),(ulong)(uint)(iVar6 % 0x3c));
              putchar(0x2f);
              iVar6 = (int)local_2c0;
              printf("%.2d:%.2d:%.2d",(ulong)(uint)((iVar6 / 0xe10) % 0x3c),
                     (ulong)(uint)((iVar6 / 0x3c) % 0x3c),(ulong)(uint)(iVar6 % 0x3c));
              pSVar3 = currentSegments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              for (pSVar18 = currentSegments.super__Vector_base<Segment,_std::allocator<Segment>_>.
                             _M_impl.super__Vector_impl_data._M_start; pSVar18 != pSVar3;
                  pSVar18 = pSVar18 + 1) {
                iVar17 = (int)((pSVar18->begin * 40.0) / local_2c0);
                iVar6 = 0x27;
                if (iVar17 < 0x27) {
                  iVar6 = iVar17;
                }
                printf("\r\x1b[C");
                if (0 < iVar17) {
                  do {
                    printf("\x1b[C");
                    iVar6 = iVar6 + -1;
                  } while (iVar6 != 0);
                }
                iVar6 = (int)(((pSVar18->end - pSVar18->begin) * 40.0) / local_2c0);
                if (iVar6 < 2) {
                  iVar6 = 1;
                }
                do {
                  putchar(0x23);
                  iVar6 = iVar6 + -1;
                } while (iVar6 != 0);
              }
            }
            fflush(_stdout);
            printf("\x1b[2K\r");
            if (iVar7 < 0) {
              perror("select()");
              goto LAB_0010af47;
            }
            piVar8 = __errno_location();
            paVar1 = &local_208.field_2;
            iVar6 = local_234;
            if (*piVar8 != 4) {
              if ((local_b8.fds_bits[0] & 1U) != 0) {
                uVar19 = getchar();
                if (uVar19 == 0x20) {
                  iVar6 = std::__cxx11::string::compare((char *)&s_currentStatus_abi_cxx11_);
                  if (iVar6 == 0) {
                    puts("Pausing");
                    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"PAUSE","")
                    ;
                    cc::sendSimpleMedia(&local_230,&local_1c8);
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)&s_currentStatus_abi_cxx11_);
                    if (iVar6 != 0) goto LAB_001099bf;
                    puts("Resuming playback");
                    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"PLAY","");
                    cc::sendSimpleMedia(&local_230,&local_1c8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
                  }
                }
                else {
                  if ((uVar19 == 0x1b) || (uVar19 == 0x71)) {
                    s_running = '\x01';
                    break;
                  }
                  if (s_verbose == true) {
                    printf("Unhandled key 0x%x\n",(ulong)uVar19);
                  }
                }
              }
LAB_001099bf:
              if (iVar7 == 0) {
                if (0.0 < nextSegmentStart) {
                  local_2c0 = nextSegmentStart;
                  tVar9 = time((time_t *)0x0);
                  if (local_2c0 <= (double)tVar9) {
                    nextSegmentStart = -1.0;
                    cc::sendSimple(&local_230,GetStatus,Media);
                  }
                }
                tVar9 = time((time_t *)0x0);
                if (0x1e < tVar9 - s_lastPing) {
                  if (s_verbose == true) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Sending ping, last ping: ",0x19);
                    poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10," current time: ",0xf);
                    poVar10 = std::ostream::_M_insert<long>((long)poVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10," delta: ",8);
                    poVar10 = std::ostream::_M_insert<long>((long)poVar10);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10)
                    ;
                    std::ostream::put((char)poVar10);
                    std::ostream::flush();
                  }
                  bVar5 = cc::sendSimple(&local_230,Ping,Heartbeat);
                  if (!bVar5) {
                    puts("Failed to send ping, assuming disconnected");
                    iVar6 = 0x6e;
                    goto LAB_0010af4f;
                  }
                  s_lastPing = time((time_t *)0x0);
                }
              }
              uVar19 = local_230.fd + 0x3f;
              if (-1 < local_230.fd) {
                uVar19 = local_230.fd;
              }
              __nbytes = local_b8.fds_bits[(int)uVar19 >> 6];
              iVar6 = local_234;
              if ((__nbytes >> ((ulong)(uint)local_230.fd & 0x3f) & 1) != 0) {
                Connection::read_abi_cxx11_
                          ((Connection *)&local_108,(int)&local_230,(void *)0x4,__nbytes);
                if (local_100 == (SSL_METHOD *)0x4) {
                  if (local_230.eof == true) {
                    puts("Connection closed");
                    iVar6 = 0x68;
                    goto LAB_00109c4a;
                  }
                  uVar19 = *(uint *)local_108;
                  uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                           uVar19 << 0x18;
                  if (uVar19 < 0x10001) {
                    Connection::read_abi_cxx11_
                              ((Connection *)&local_e8,(int)&local_230,(void *)(ulong)uVar19,
                               __nbytes);
                    if (local_e0 < (SSL_METHOD *)(ulong)uVar19) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Short read, expected ",0x15);
                      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10," got ",5);
                      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      iVar6 = 0x4a;
LAB_0010ae58:
                      bVar5 = false;
                    }
                    else {
                      local_1c8._M_string_length = 0;
                      local_1c8._M_dataplus._M_p = (pointer)&PTR__CastMessage_00129a40;
                      local_1c8.field_2._M_allocated_capacity = (size_type)&local_1a8;
                      local_1c8.field_2._8_8_ = 0;
                      local_1a8 = '\0';
                      local_198 = &local_188;
                      local_190 = 0;
                      local_188 = '\0';
                      local_178 = &local_168;
                      local_170 = 0;
                      local_168 = '\0';
                      local_158 = 0;
                      local_150 = &local_140;
                      local_148 = 0;
                      local_140 = 0;
                      local_130 = &local_120;
                      local_128 = 0;
                      local_120 = 0;
                      bVar5 = ec::
                              cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                              ::parse((cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                                       *)&local_1c8,local_e8,(size_t)local_e0);
                      if (bVar5) {
                        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_258,local_150,local_150 + local_148);
                        if (local_258._M_string_length == 0) {
                          puts("No string payload");
                          bVar5 = true;
                        }
                        else {
                          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_298,"\"type\"\\s*:\\s*\"([^\"]+)\"","");
                          regexExtract(&local_1e8,&local_298,&local_258);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_298._M_dataplus._M_p != &local_298.field_2) {
                            operator_delete(local_298._M_dataplus._M_p,
                                            local_298.field_2._M_allocated_capacity + 1);
                          }
                          iVar6 = std::__cxx11::string::compare((char *)&local_1e8);
                          if ((iVar6 != 0) && (s_verbose == true)) {
                            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 (char *)local_1c8.field_2._M_allocated_capacity,
                                                 local_1c8.field_2._8_8_);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar10," > ",3);
                            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar10,local_198,local_190);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
                            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar10,local_178,local_170);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"): \n",4);
                            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar10,local_258._M_dataplus._M_p,
                                                 local_258._M_string_length);
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                            (char)poVar10);
                            std::ostream::put((char)poVar10);
                            std::ostream::flush();
                          }
                          iVar6 = std::__cxx11::string::compare((char *)&local_1e8);
                          if (iVar6 == 0) {
                            urn = Connect;
                            std::__cxx11::string::_M_replace
                                      (0x12a860,0,
                                       (char *)s_currentStatus_abi_cxx11_._M_string_length,0x11e852)
                            ;
LAB_0010a226:
                            bVar5 = true;
                            cc::sendSimple(&local_230,urn,urn);
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)&local_1e8);
                            if (iVar6 == 0) {
                              std::__cxx11::string::_M_replace
                                        (0x12a860,0,
                                         (char *)s_currentStatus_abi_cxx11_._M_string_length,
                                         0x11f090);
                              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                   (char *)local_1c8.field_2._M_allocated_capacity,
                                                   local_1c8.field_2._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar10," > ",3);
                              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar10,local_198,local_190);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
                              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar10,local_178,local_170);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"): \n",4);
                              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar10,local_258._M_dataplus._M_p,
                                                   local_258._M_string_length);
                              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                              (char)poVar10);
                              std::ostream::put((char)poVar10);
                              std::ostream::flush();
                              bVar5 = false;
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare((char *)&local_1e8);
                              if (iVar6 == 0) {
                                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2e0,"\"duration\"\\s*:\\s*([0-9.]+)","")
                                ;
                                regexExtract(&local_298,&local_2e0,&local_258);
                                _Var4._M_p = local_298._M_dataplus._M_p;
                                if (local_298._M_string_length != 0) {
                                  local_2b8._M_dataplus._M_p = (pointer)0x0;
                                  dVar2 = strtod(local_298._M_dataplus._M_p,(char **)&local_2b8);
                                  if ((local_2b8._M_dataplus._M_p != _Var4._M_p) &&
                                     ((ulong)ABS(dVar2) < 0x7ff0000000000000 && *piVar8 != 0x22)) {
                                    currentDuration = dVar2;
                                  }
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                                  operator_delete(local_298._M_dataplus._M_p,
                                                  local_298.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                                  operator_delete(local_2e0._M_dataplus._M_p,
                                                  local_2e0.field_2._M_allocated_capacity + 1);
                                }
                                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2e0,"\"currentTime\"\\s*:\\s*([0-9.]+)",
                                           "");
                                regexExtract(&local_298,&local_2e0,&local_258);
                                _Var4._M_p = local_298._M_dataplus._M_p;
                                if (local_298._M_string_length == 0) {
LAB_0010a4a3:
                                  bVar5 = false;
                                }
                                else {
                                  local_2b8._M_dataplus._M_p = (pointer)0x0;
                                  dVar2 = strtod(local_298._M_dataplus._M_p,(char **)&local_2b8);
                                  if ((local_2b8._M_dataplus._M_p == _Var4._M_p) ||
                                     (0x7fefffffffffffff < (ulong)ABS(dVar2) || *piVar8 == 0x22))
                                  goto LAB_0010a4a3;
                                  bVar5 = true;
                                  s_currentPosition = dVar2;
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                                  operator_delete(local_298._M_dataplus._M_p,
                                                  local_298.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                                  operator_delete(local_2e0._M_dataplus._M_p,
                                                  local_2e0.field_2._M_allocated_capacity + 1);
                                }
                                if (bVar5) {
                                  tVar9 = time((time_t *)0x0);
                                  s_lastPositionFetched = (double)tVar9;
                                }
                                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2e0,
                                           "\"playerState\"\\s*:\\s*\"([A-Z]+)\"","");
                                regexExtract(&local_298,&local_2e0,&local_258);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                                  operator_delete(local_2e0._M_dataplus._M_p,
                                                  local_2e0.field_2._M_allocated_capacity + 1);
                                }
                                if (local_298._M_string_length != 0) {
                                  iVar6 = std::__cxx11::string::compare((char *)&local_298);
                                  currentlyPlaying = iVar6 == 0;
                                  std::__cxx11::string::_M_assign
                                            ((string *)&s_currentStatus_abi_cxx11_);
                                }
                                local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2b8,
                                           "\"mediaSessionId\"\\s*:\\s*([0-9]+)","");
                                regexExtract(&local_2e0,&local_2b8,&local_258);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                                  operator_delete(local_2b8._M_dataplus._M_p,
                                                  local_2b8.field_2._M_allocated_capacity + 1);
                                }
                                if (local_2e0._M_string_length != 0) {
                                  if (s_verbose == true) {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"Got media session ",0x12);
                                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         local_2e0._M_dataplus._M_p,
                                                         local_2e0._M_string_length);
                                    std::endl<char,std::char_traits<char>>(poVar10);
                                  }
                                  std::__cxx11::string::_M_assign
                                            ((string *)&cc::mediaSession_abi_cxx11_);
                                }
                                if (s_youtube == '\x01') {
                                  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_278,
                                             "\"contentId\"\\s*:\\s*\"([A-Za-z0-9_-]+)\"","");
                                  regexExtract(&local_2b8,&local_278,&local_258);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_278._M_dataplus._M_p != &local_278.field_2) {
                                    operator_delete(local_278._M_dataplus._M_p,
                                                    local_278.field_2._M_allocated_capacity + 1);
                                  }
                                  if (s_verbose == true) {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"Video id: \'",0xb);
                                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         local_2b8._M_dataplus._M_p,
                                                         local_2b8._M_string_length);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10,"\'",1);
                                    std::endl<char,std::char_traits<char>>(poVar10);
                                  }
                                  if ((local_2b8._M_string_length != 0) &&
                                     ((local_2b8._M_string_length !=
                                       currentVideo_abi_cxx11_._M_string_length ||
                                      (iVar6 = bcmp(local_2b8._M_dataplus._M_p,
                                                    currentVideo_abi_cxx11_._M_dataplus._M_p,
                                                    local_2b8._M_string_length), iVar6 != 0)))) {
                                    downloadSegments((vector<Segment,_std::allocator<Segment>_> *)
                                                     &local_278,&local_2b8);
                                    std::vector<Segment,_std::allocator<Segment>_>::_M_move_assign
                                              (&currentSegments,&local_278);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_278._M_dataplus._M_p !=
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)0x0) {
                                      operator_delete(local_278._M_dataplus._M_p,
                                                      local_278.field_2._M_allocated_capacity -
                                                      (long)local_278._M_dataplus._M_p);
                                    }
                                    std::__cxx11::string::_M_assign
                                              ((string *)&currentVideo_abi_cxx11_);
                                    nextSegmentStart = -1.0;
                                  }
                                  if (currentSegments.
                                      super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                      super__Vector_impl_data._M_start !=
                                      currentSegments.
                                      super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                      super__Vector_impl_data._M_finish) {
                                    local_2c0 = secondsUntilNextSegment();
                                    if (s_verbose == true) {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"time to next segment: ",0x16
                                                );
                                      poVar10 = std::ostream::_M_insert<double>(local_2c0);
                                      std::endl<char,std::char_traits<char>>(poVar10);
                                    }
                                    if (0.0 <= local_2c0) {
                                      tVar9 = time((time_t *)0x0);
                                      nextSegmentStart = local_2c0 + (double)tVar9;
                                    }
                                    maybeSeek(&local_230);
                                  }
                                  local_208._M_dataplus._M_p = (pointer)paVar1;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_208,
                                             "\"playerState\"\\s*:\\s*(-?[0-9]+)","");
                                  regexExtract(&local_278,&local_208,&local_258);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_208._M_dataplus._M_p != paVar1) {
                                    operator_delete(local_208._M_dataplus._M_p,
                                                    CONCAT44(local_208.field_2._M_allocated_capacity
                                                             ._4_4_,local_208.field_2.
                                                                    _M_allocated_capacity._0_4_) + 1
                                                   );
                                  }
                                  if (s_verbose == true) {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"Custom player state: ",0x15);
                                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         local_278._M_dataplus._M_p,
                                                         local_278._M_string_length);
                                    std::endl<char,std::char_traits<char>>(poVar10);
                                  }
                                  if ((s_adblock == '\x01') &&
                                     (iVar6 = std::__cxx11::string::compare((char *)&local_278),
                                     iVar6 == 0)) {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               " Playing an ad, attempting to skip",0x22);
                                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                                    dVar2 = currentPosition();
                                    local_2c0 = 0.0;
                                    if (0.0 <= dVar2) {
                                      local_2c0 = dVar2;
                                    }
                                    local_2c0 = local_2c0 + 1.0;
                                    local_208.field_2._M_allocated_capacity._0_4_ = 0x504f5453;
                                    local_208._M_string_length = 4;
                                    local_208.field_2._M_allocated_capacity._4_4_ =
                                         local_208.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                                    local_208._M_dataplus._M_p = (pointer)paVar1;
                                    cc::sendSimpleMedia(&local_230,&local_208);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_208._M_dataplus._M_p != paVar1) {
                                      operator_delete(local_208._M_dataplus._M_p,
                                                      CONCAT44(local_208.field_2.
                                                               _M_allocated_capacity._4_4_,
                                                               local_208.field_2.
                                                               _M_allocated_capacity._0_4_) + 1);
                                    }
                                    cc::loadMedia(&local_230,&currentVideo_abi_cxx11_,local_2c0);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_278._M_dataplus._M_p != &local_278.field_2) {
                                    operator_delete(local_278._M_dataplus._M_p,
                                                    local_278.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                                    operator_delete(local_2b8._M_dataplus._M_p,
                                                    local_2b8.field_2._M_allocated_capacity + 1);
                                  }
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                                  operator_delete(local_2e0._M_dataplus._M_p,
                                                  local_2e0.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                                  operator_delete(local_298._M_dataplus._M_p,
                                                  local_298.field_2._M_allocated_capacity + 1);
                                }
                                bVar5 = true;
                              }
                              else {
                                iVar6 = std::__cxx11::string::compare((char *)&local_178);
                                if (iVar6 == 0) {
                                  iVar6 = std::__cxx11::string::compare((char *)&local_1e8);
                                  bVar5 = true;
                                  if (iVar6 == 0) {
                                    urn = Pong;
                                    goto LAB_0010a226;
                                  }
                                }
                                else {
                                  iVar6 = std::__cxx11::string::compare((char *)&local_178);
                                  if (iVar6 == 0) {
                                    iVar6 = std::__cxx11::string::compare((char *)&local_1e8);
                                    bVar5 = true;
                                    if (iVar6 == 0) {
                                      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_2e0,
                                                 "\"displayName\"\\s*:\\s*\"([^\"]+)\"","");
                                      regexExtract(&local_298,&local_2e0,&local_258);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                                        operator_delete(local_2e0._M_dataplus._M_p,
                                                        local_2e0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_2b8,
                                                 "\"sessionId\"\\s*:\\s*\"([^\"]+)\"","");
                                      regexExtract(&local_2e0,&local_2b8,&local_258);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                                        operator_delete(local_2b8._M_dataplus._M_p,
                                                        local_2b8.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if (s_verbose == true) {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,"app display name: ",0x12);
                                        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             local_298._M_dataplus._M_p,
                                                             local_298._M_string_length);
                                        std::endl<char,std::char_traits<char>>(poVar10);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,"session: ",9);
                                        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             local_2e0._M_dataplus._M_p,
                                                             local_2e0._M_string_length);
                                        std::endl<char,std::char_traits<char>>(poVar10);
                                      }
                                      if (local_2e0._M_string_length != 0) {
                                        std::__cxx11::string::_M_assign
                                                  ((string *)&cc::dest_abi_cxx11_);
                                      }
                                      iVar6 = std::__cxx11::string::compare((char *)&local_298);
                                      if (iVar6 == 0) {
                                        s_youtube = '\x01';
                                        if (s_verbose == true) {
                                          puts("Youtube playing");
                                        }
                                      }
                                      else if (local_298._M_string_length != 0) {
                                        s_youtube = '\0';
                                        std::operator+(&local_278,"Not youtube: \'",&local_298);
                                        plVar11 = (long *)std::__cxx11::string::append
                                                                    ((char *)&local_278);
                                        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
                                        psVar14 = (size_type *)(plVar11 + 2);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)*plVar11 ==
                                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)psVar14) {
                                          local_2b8.field_2._M_allocated_capacity = *psVar14;
                                          local_2b8.field_2._8_8_ = plVar11[3];
                                        }
                                        else {
                                          local_2b8.field_2._M_allocated_capacity = *psVar14;
                                          local_2b8._M_dataplus._M_p = (pointer)*plVar11;
                                        }
                                        local_2b8._M_string_length = plVar11[1];
                                        *plVar11 = (long)psVar14;
                                        plVar11[1] = 0;
                                        *(undefined1 *)(plVar11 + 2) = 0;
                                        std::__cxx11::string::operator=
                                                  ((string *)&s_currentStatus_abi_cxx11_,
                                                   (string *)&local_2b8);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                                          operator_delete(local_2b8._M_dataplus._M_p,
                                                          local_2b8.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_278._M_dataplus._M_p != &local_278.field_2) {
                                          operator_delete(local_278._M_dataplus._M_p,
                                                          local_278.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                      }
                                      lVar12 = std::__cxx11::string::find
                                                         ((char *)&local_258,0x11eed5,0);
                                      if (lVar12 != -1) {
                                        if (s_verbose == true) {
                                          puts("Sending get status for media");
                                        }
                                        cc::sendSimple(&local_230,Connect,Connection);
                                        cc::sendSimple(&local_230,GetStatus,Media);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                                        operator_delete(local_2e0._M_dataplus._M_p,
                                                        local_2e0.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_298._M_dataplus._M_p != &local_298.field_2) {
                                        operator_delete(local_298._M_dataplus._M_p,
                                                        local_298.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                    }
                                  }
                                  else {
                                    iVar6 = std::__cxx11::string::compare((char *)&local_1e8);
                                    bVar5 = true;
                                    if (iVar6 != 0) {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cerr,"Unhandled message type: ",
                                                 0x18);
                                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cerr,
                                                           local_1e8._M_dataplus._M_p,
                                                           local_1e8._M_string_length);
                                      std::endl<char,std::char_traits<char>>(poVar10);
                                    }
                                  }
                                }
                              }
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                            operator_delete(local_1e8._M_dataplus._M_p,
                                            local_1e8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_258._M_dataplus._M_p != &local_258.field_2) {
                          operator_delete(local_258._M_dataplus._M_p,
                                          local_258.field_2._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        puts("Parsing message from chromecast failed");
                        bVar5 = false;
                      }
                      local_1c8._M_dataplus._M_p = (pointer)&PTR__CastMessage_00129a40;
                      if (local_130 != &local_120) {
                        operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
                      }
                      if (local_150 != &local_140) {
                        operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
                      }
                      if (local_178 != &local_168) {
                        operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
                      }
                      if (local_198 != &local_188) {
                        operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
                      }
                      if ((char *)local_1c8.field_2._M_allocated_capacity != &local_1a8) {
                        operator_delete((void *)local_1c8.field_2._M_allocated_capacity,
                                        CONCAT71(uStack_1a7,local_1a8) + 1);
                      }
                      if (!bVar5) {
                        pcVar16 = "Failed to parse message";
LAB_0010ae4d:
                        puts(pcVar16);
                        iVar6 = 0x68;
                        goto LAB_0010ae58;
                      }
                      if (local_230.eof == true) {
                        pcVar16 = "Disconnected";
                        goto LAB_0010ae4d;
                      }
                      s_lastPing = time((time_t *)0x0);
                      bVar5 = true;
                      iVar6 = local_234;
                    }
                    if (local_e8 != local_d8) {
                      operator_delete(local_e8,(long)local_d8[0] + 1);
                    }
                  }
                  else {
                    bVar5 = false;
                    printf("Message length out of range: %d\n",(ulong)uVar19);
                    iVar6 = 0x4a;
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Failed to read message size: \'",0x1e);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,(char *)local_108,(long)local_100);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  iVar6 = 0x4a;
LAB_00109c4a:
                  bVar5 = false;
                }
                if (local_108 != local_f8) {
                  operator_delete(local_108,(long)local_f8[0] + 1);
                }
                if (!bVar5) goto LAB_0010af4f;
              }
            }
            iVar7 = iVar6;
          } while (s_running == '\0');
          iVar6 = 0;
        }
        goto LAB_0010af4f;
      }
      pcVar16 = "Failed to send getstatus message";
    }
    else {
      pcVar16 = "Failed to send connect message";
    }
    puts(pcVar16);
  }
LAB_0010af47:
  piVar8 = __errno_location();
  iVar6 = *piVar8;
LAB_0010af4f:
  Connection::~Connection(&local_230);
  return iVar6;
}

Assistant:

int loop(const sockaddr_in &address)
{
    cc::dest = "";

    if (s_verbose) {
        puts("Opening connection");
    }
    Connection connection;
    if (!connection.connect(address)) {
        std::cerr << "Failed to connect to " << inet_ntoa(address.sin_addr) << std::endl;
        return errno;
    }
    if (s_verbose) {
        puts("Sending connection message");
    }
    if (!cc::sendSimple(connection, cc::msg::Connect, cc::ns::Connection)) {
        puts("Failed to send connect message");
        return errno;
    }
    puts("Connected");
    if (!cc::sendSimple(connection, cc::msg::GetStatus, cc::ns::Receiver)) {
        puts("Failed to send getstatus message");
        return errno;
    }
    s_lastPing = time(nullptr);

    while (s_running && !connection.eof) {
        fd_set fdset;
        FD_ZERO(&fdset);
        FD_SET(connection.fd, &fdset);
        FD_SET(STDIN_FILENO, &fdset);

        timeval timeout;
        timeout.tv_sec = 1; // max 1 second so we can update the progress bar
        timeout.tv_usec = 0;
        const int events = select(connection.fd + 1, &fdset, 0, 0, &timeout);
        printProgress(currentPosition(), currentDuration);

        if (events < 0) {
            perror("select()");
            return errno;
        }
        if (errno == EINTR) {
            continue;
        }

        if (FD_ISSET(STDIN_FILENO, &fdset)) {
            const int key = getchar();
            switch(key) {
            case 'q':
            case '\x1b':
                s_running = false;
                return 0;
            case ' ':
                if (s_currentStatus == "PLAYING") {
                    puts("Pausing");
                    cc::sendSimpleMedia(connection, "PAUSE");
                } else if (s_currentStatus == "PAUSED") {
                    puts("Resuming playback");
                    cc::sendSimpleMedia(connection, "PLAY");
                }
                break;
            default:
                if (s_verbose) printf("Unhandled key 0x%x\n", key);
                break;
            }
        }

        if (events == 0) { // timeout
            if (nextSegmentStart > 0 && nextSegmentStart <= time(nullptr)) {
                nextSegmentStart = -1;
                // Update to make sure we are in sync before we skip the sponsor
                cc::sendSimple(connection, cc::msg::GetStatus, cc::ns::Media);
            }

            const time_t currentTime = time(nullptr);
            if (currentTime - s_lastPing > PING_INTERVAL) {
                if (s_verbose) {
                    std::cout << "Sending ping, last ping: " << s_lastPing << " current time: " << currentTime << " delta: " << (currentTime - s_lastPing) << std::endl;
                }
                if (!cc::sendSimple(connection, cc::msg::Ping, cc::ns::Heartbeat)) {
                    puts("Failed to send ping, assuming disconnected");
                    return ETIMEDOUT;
                }
                s_lastPing = time(nullptr);
            }
        }

        if (!FD_ISSET(connection.fd, &fdset)) {
            continue;
        }

        std::string msgLengthBuffer = connection.read(sizeof(uint32_t));
        if (msgLengthBuffer.size() != 4) {
            std::cerr << "Failed to read message size: '" << msgLengthBuffer << "'" << std::endl;
            return EBADMSG;
        }
        if (connection.eof) {
            puts("Connection closed");
            return ECONNRESET;
        }
        uint32_t msgLength = 0;
        memcpy(&msgLength, msgLengthBuffer.data(), sizeof msgLength);
        msgLength = ntohl(msgLength);
        if (msgLength > 64 * 1024) { // 64kb max according to the spec
            printf("Message length out of range: %d\n", msgLength);
            return EBADMSG;
        }

        std::string response = connection.read(msgLength);
        if (response.size() < msgLength) {
            std::cerr << "Short read, expected " << msgLength << " got " << response.size() << std::endl;
            return EBADMSG;
        }
        if (!handleMessage(&connection, response)) {
            puts("Failed to parse message");
            return ECONNRESET;
        }
        if (connection.eof) {
            puts("Disconnected");
            return ECONNRESET;
        }

        // We got a valid message
        s_lastPing = time(nullptr);
    }
    return 0;
}